

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall
Assembler::processLdStrAbsolute(Assembler *this,string *instruction,int reg,string *operand)

{
  bool bVar1;
  string local_c8;
  string local_a8;
  string local_88;
  string local_58;
  int local_34;
  int local_30;
  int value;
  int adr;
  int regs;
  string *operand_local;
  string *psStack_18;
  int reg_local;
  string *instruction_local;
  Assembler *this_local;
  
  value = reg + 0xf;
  local_30 = 0;
  _adr = operand;
  operand_local._4_4_ = reg;
  psStack_18 = instruction;
  instruction_local = &this->inputFileName;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (operand,&symbolReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,(string *)operand);
    local_34 = processAbsoluteAddressingSymbol(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_88,(string *)instruction);
    instr5Bytes(this,&local_88,value,local_30,local_34);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,(string *)operand);
    local_34 = literalToDecimal(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string((string *)&local_c8,(string *)instruction);
    instr5Bytes(this,&local_c8,value,local_30,local_34);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void Assembler::processLdStrAbsolute(string instruction, int reg, string operand) {
    int regs = reg + 0xF;
    int adr = 0;
    int value;
    if (regex_match(operand, symbolReg)) {
        value = processAbsoluteAddressingSymbol(operand);
        instr5Bytes(instruction, regs, adr, value);
    } else {
        value = literalToDecimal(operand);
        instr5Bytes(instruction, regs, adr, value);
    }
    return;
}